

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O3

uint __thiscall Kernel::Term::computeDistinctVars(Term *this)

{
  bool bVar1;
  ulong uVar2;
  size_t i;
  long lVar3;
  uint uVar4;
  bool dummy;
  Set<unsigned_int,_Lib::DefaultHash> vars;
  undefined4 local_98;
  bool local_91;
  Set<unsigned_int,_Lib::DefaultHash> local_90;
  VariableIterator local_68;
  
  local_90._capacity = 0;
  local_90._nonemptyCells = 0;
  local_90._size = 0;
  local_90._entries = (Cell *)0x0;
  Lib::Set<unsigned_int,_Lib::DefaultHash>::expand(&local_90);
  VariableIterator::VariableIterator(&local_68,this);
  while( true ) {
    bVar1 = VariableIterator::hasNext(&local_68);
    uVar4 = local_90._size;
    if (!bVar1) break;
    local_68._used = true;
    local_98 = (undefined4)(local_68._stack._cursor[-1]->_content >> 2);
    uVar4 = 0x811c9dc5;
    lVar3 = 0;
    do {
      uVar4 = (*(byte *)((long)&local_98 + lVar3) ^ uVar4) * 0x1000193;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    Lib::Set<unsigned_int,Lib::DefaultHash>::
    rawFindOrInsert<Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda()_1_,Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda(auto:1)_1_>
              ((Set<unsigned_int,Lib::DefaultHash> *)&local_90,(anon_class_8_1_ba1d8281)&local_98,
               uVar4,(anon_class_8_1_ba1d8281)&local_98,&local_91);
  }
  local_68.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
       (_func_int **)&PTR__VariableIterator_00b3d820;
  if (local_68._stack._stack != (TermList **)0x0) {
    uVar2 = local_68._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *local_68._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68._stack._stack;
    }
    else if (uVar2 < 0x11) {
      *local_68._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_68._stack._stack;
    }
    else if (uVar2 < 0x19) {
      *local_68._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_68._stack._stack;
    }
    else if (uVar2 < 0x21) {
      *local_68._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_68._stack._stack;
    }
    else if (uVar2 < 0x31) {
      *local_68._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_68._stack._stack;
    }
    else if (uVar2 < 0x41) {
      *local_68._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_68._stack._stack;
    }
    else {
      operator_delete(local_68._stack._stack,0x10);
    }
  }
  if (local_90._entries != (Cell *)0x0) {
    uVar2 = (long)local_90._capacity * 8 + 0xfU & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      (local_90._entries)->code = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      (local_90._entries)->value = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_90._entries;
    }
    else if (uVar2 < 0x11) {
      (local_90._entries)->code = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      (local_90._entries)->value = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_90._entries;
    }
    else if (uVar2 < 0x19) {
      (local_90._entries)->code = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      (local_90._entries)->value = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_90._entries;
    }
    else if (uVar2 < 0x21) {
      (local_90._entries)->code = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      (local_90._entries)->value = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_90._entries;
    }
    else if (uVar2 < 0x31) {
      (local_90._entries)->code = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      (local_90._entries)->value = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_90._entries;
    }
    else if (uVar2 < 0x41) {
      (local_90._entries)->code = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      (local_90._entries)->value = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_90._entries;
    }
    else {
      operator_delete(local_90._entries,0x10);
    }
  }
  return uVar4;
}

Assistant:

unsigned Term::computeDistinctVars() const
{
  Set<unsigned> vars;
  VariableIterator vit(this);
  while (vit.hasNext()) {
    vars.insert(vit.next().var());
  }
  return vars.size();
}